

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownField::Reset(UnknownField *this)

{
  Type TVar1;
  UnknownField *this_local;
  
  TVar1 = type(this);
  if (TVar1 == TYPE_LENGTH_DELIMITED) {
    (this->data_).varint_ = 0;
  }
  else if (TVar1 == TYPE_GROUP) {
    (this->data_).varint_ = 0;
  }
  return;
}

Assistant:

void UnknownField::Reset() {
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      data_.length_delimited_.string_value_ = NULL;
      break;
    case UnknownField::TYPE_GROUP: {
      data_.group_ = NULL;
      break;
    }
    default:
      break;
  }
}